

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

void __thiscall
spvtools::opt::Module::ForEachInst
          (Module *this,function<void_(const_spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts)

{
  Instruction *pIVar1;
  pointer pIVar2;
  pointer puVar3;
  function<void_(const_spvtools::opt::Instruction_*)> *f_00;
  char cVar4;
  undefined7 in_register_00000011;
  unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> *i_11;
  pointer puVar5;
  Instruction *dbg_line;
  pointer pIVar6;
  Instruction *pIVar7;
  pointer pIVar8;
  Instruction *i_12;
  Instruction *dbg_line_3;
  Instruction *i;
  Instruction *pIVar9;
  bool bVar10;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_80;
  function<void_(const_spvtools::opt::Instruction_*)> *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  Instruction *local_50;
  pointer local_48;
  Module *local_40;
  function<void_(const_spvtools::opt::Instruction_*)> *local_38;
  
  local_48 = (pointer)CONCAT44(local_48._4_4_,
                               (int)CONCAT71(in_register_00000011,run_on_debug_line_insts));
  local_50 = &(this->capabilities_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar9 = (this->capabilities_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_40 = this;
  local_38 = f;
  if (pIVar9 != local_50) {
    do {
      uStack_70 = 0;
      pcStack_60 = std::
                   _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_78 = local_38;
      if ((char)local_48 != '\0') {
        pIVar6 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar8 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar6 != pIVar8) {
          bVar10 = false;
          do {
            local_80._M_head_impl = pIVar6;
            if (local_68 == (code *)0x0) goto LAB_0026788d;
            cVar4 = (*pcStack_60)(&local_78,&local_80);
            if (cVar4 == '\0') {
              if (!bVar10) goto LAB_00266cbc;
              break;
            }
            pIVar6 = pIVar6 + 1;
            bVar10 = pIVar6 == pIVar8;
          } while (!bVar10);
        }
      }
      local_80._M_head_impl = pIVar9;
      if (local_68 == (code *)0x0) goto LAB_0026788d;
      (*pcStack_60)(&local_78,&local_80);
LAB_00266cbc:
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar9 != local_50);
  }
  local_50 = &(local_40->extensions_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar9 = (local_40->extensions_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar9 != local_50) {
    do {
      uStack_70 = 0;
      pcStack_60 = std::
                   _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_78 = local_38;
      if ((char)local_48 != '\0') {
        pIVar7 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar7 != pIVar1) {
          bVar10 = false;
          do {
            local_80._M_head_impl = pIVar7;
            if (local_68 == (code *)0x0) goto LAB_0026788d;
            cVar4 = (*pcStack_60)(&local_78,&local_80);
            if (cVar4 == '\0') {
              if (!bVar10) goto LAB_00266d9f;
              break;
            }
            pIVar7 = pIVar7 + 1;
            bVar10 = pIVar7 == pIVar1;
          } while (!bVar10);
        }
      }
      local_80._M_head_impl = pIVar9;
      if (local_68 == (code *)0x0) goto LAB_0026788d;
      (*pcStack_60)(&local_78,&local_80);
LAB_00266d9f:
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar9 != local_50);
  }
  local_50 = &(local_40->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>.
              sentinel_;
  pIVar9 = (local_40->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar9 != local_50) {
    do {
      uStack_70 = 0;
      pcStack_60 = std::
                   _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_78 = local_38;
      if ((char)local_48 != '\0') {
        pIVar7 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar7 != pIVar1) {
          bVar10 = false;
          do {
            local_80._M_head_impl = pIVar7;
            if (local_68 == (code *)0x0) goto LAB_0026788d;
            cVar4 = (*pcStack_60)(&local_78,&local_80);
            if (cVar4 == '\0') {
              if (!bVar10) goto LAB_00266e82;
              break;
            }
            pIVar7 = pIVar7 + 1;
            bVar10 = pIVar7 == pIVar1;
          } while (!bVar10);
        }
      }
      local_80._M_head_impl = pIVar9;
      if (local_68 == (code *)0x0) goto LAB_0026788d;
      (*pcStack_60)(&local_78,&local_80);
LAB_00266e82:
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar9 != local_50);
  }
  pIVar6 = (local_40->memory_model_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar6 != (pointer)0x0) {
    uStack_70 = 0;
    pcStack_60 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
               ::_M_manager;
    local_78 = local_38;
    if ((char)local_48 != '\0') {
      pIVar8 = (pIVar6->dbg_line_insts_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pIVar2 = *(pointer *)
                ((long)&(pIVar6->dbg_line_insts_).
                        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                + 8);
      if (pIVar8 != pIVar2) {
        bVar10 = false;
        do {
          local_80._M_head_impl = pIVar8;
          if (local_68 == (code *)0x0) goto LAB_0026788d;
          cVar4 = (*pcStack_60)(&local_78,&local_80);
          if (cVar4 == '\0') {
            if (!bVar10) goto LAB_00266f5e;
            break;
          }
          pIVar8 = pIVar8 + 1;
          bVar10 = pIVar8 == pIVar2;
        } while (!bVar10);
      }
    }
    local_80._M_head_impl = pIVar6;
    if (local_68 == (code *)0x0) goto LAB_0026788d;
    (*pcStack_60)(&local_78,&local_80);
LAB_00266f5e:
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,3);
    }
  }
  pIVar6 = (local_40->sampled_image_address_mode_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar6 != (pointer)0x0) {
    uStack_70 = 0;
    pcStack_60 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
               ::_M_manager;
    local_78 = local_38;
    if ((char)local_48 != '\0') {
      pIVar8 = (pIVar6->dbg_line_insts_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pIVar2 = *(pointer *)
                ((long)&(pIVar6->dbg_line_insts_).
                        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                + 8);
      if (pIVar8 != pIVar2) {
        bVar10 = false;
        do {
          local_80._M_head_impl = pIVar8;
          if (local_68 == (code *)0x0) goto LAB_0026788d;
          cVar4 = (*pcStack_60)(&local_78,&local_80);
          if (cVar4 == '\0') {
            if (!bVar10) goto LAB_0026702d;
            break;
          }
          pIVar8 = pIVar8 + 1;
          bVar10 = pIVar8 == pIVar2;
        } while (!bVar10);
      }
    }
    local_80._M_head_impl = pIVar6;
    if (local_68 == (code *)0x0) {
LAB_0026788d:
      std::__throw_bad_function_call();
    }
    (*pcStack_60)(&local_78,&local_80);
LAB_0026702d:
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,3);
    }
  }
  local_50 = &(local_40->entry_points_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar9 = (local_40->entry_points_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar9 != local_50) {
    do {
      uStack_70 = 0;
      pcStack_60 = std::
                   _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_78 = local_38;
      if ((char)local_48 != '\0') {
        pIVar7 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar7 != pIVar1) {
          bVar10 = false;
          do {
            local_80._M_head_impl = pIVar7;
            if (local_68 == (code *)0x0) goto LAB_0026788d;
            cVar4 = (*pcStack_60)(&local_78,&local_80);
            if (cVar4 == '\0') {
              if (!bVar10) goto LAB_00267103;
              break;
            }
            pIVar7 = pIVar7 + 1;
            bVar10 = pIVar7 == pIVar1;
          } while (!bVar10);
        }
      }
      local_80._M_head_impl = pIVar9;
      if (local_68 == (code *)0x0) goto LAB_0026788d;
      (*pcStack_60)(&local_78,&local_80);
LAB_00267103:
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar9 != local_50);
  }
  local_50 = &(local_40->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
  ;
  pIVar9 = (local_40->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar9 != local_50) {
    do {
      uStack_70 = 0;
      pcStack_60 = std::
                   _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_78 = local_38;
      if ((char)local_48 != '\0') {
        pIVar7 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar7 != pIVar1) {
          bVar10 = false;
          do {
            local_80._M_head_impl = pIVar7;
            if (local_68 == (code *)0x0) goto LAB_0026788d;
            cVar4 = (*pcStack_60)(&local_78,&local_80);
            if (cVar4 == '\0') {
              if (!bVar10) goto LAB_002671e6;
              break;
            }
            pIVar7 = pIVar7 + 1;
            bVar10 = pIVar7 == pIVar1;
          } while (!bVar10);
        }
      }
      local_80._M_head_impl = pIVar9;
      if (local_68 == (code *)0x0) goto LAB_0026788d;
      (*pcStack_60)(&local_78,&local_80);
LAB_002671e6:
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar9 != local_50);
  }
  local_50 = &(local_40->debugs1_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar9 = (local_40->debugs1_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar9 != local_50) {
    do {
      uStack_70 = 0;
      pcStack_60 = std::
                   _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_78 = local_38;
      if ((char)local_48 != '\0') {
        pIVar7 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar7 != pIVar1) {
          bVar10 = false;
          do {
            local_80._M_head_impl = pIVar7;
            if (local_68 == (code *)0x0) goto LAB_0026788d;
            cVar4 = (*pcStack_60)(&local_78,&local_80);
            if (cVar4 == '\0') {
              if (!bVar10) goto LAB_002672c9;
              break;
            }
            pIVar7 = pIVar7 + 1;
            bVar10 = pIVar7 == pIVar1;
          } while (!bVar10);
        }
      }
      local_80._M_head_impl = pIVar9;
      if (local_68 == (code *)0x0) goto LAB_0026788d;
      (*pcStack_60)(&local_78,&local_80);
LAB_002672c9:
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar9 != local_50);
  }
  local_50 = &(local_40->debugs2_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar9 = (local_40->debugs2_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar9 != local_50) {
    do {
      uStack_70 = 0;
      pcStack_60 = std::
                   _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_78 = local_38;
      if ((char)local_48 != '\0') {
        pIVar7 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar7 != pIVar1) {
          bVar10 = false;
          do {
            local_80._M_head_impl = pIVar7;
            if (local_68 == (code *)0x0) goto LAB_0026788d;
            cVar4 = (*pcStack_60)(&local_78,&local_80);
            if (cVar4 == '\0') {
              if (!bVar10) goto LAB_002673ac;
              break;
            }
            pIVar7 = pIVar7 + 1;
            bVar10 = pIVar7 == pIVar1;
          } while (!bVar10);
        }
      }
      local_80._M_head_impl = pIVar9;
      if (local_68 == (code *)0x0) goto LAB_0026788d;
      (*pcStack_60)(&local_78,&local_80);
LAB_002673ac:
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar9 != local_50);
  }
  local_50 = &(local_40->debugs3_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar9 = (local_40->debugs3_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar9 != local_50) {
    do {
      uStack_70 = 0;
      pcStack_60 = std::
                   _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_78 = local_38;
      if ((char)local_48 != '\0') {
        pIVar7 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar7 != pIVar1) {
          bVar10 = false;
          do {
            local_80._M_head_impl = pIVar7;
            if (local_68 == (code *)0x0) goto LAB_0026788d;
            cVar4 = (*pcStack_60)(&local_78,&local_80);
            if (cVar4 == '\0') {
              if (!bVar10) goto LAB_0026748f;
              break;
            }
            pIVar7 = pIVar7 + 1;
            bVar10 = pIVar7 == pIVar1;
          } while (!bVar10);
        }
      }
      local_80._M_head_impl = pIVar9;
      if (local_68 == (code *)0x0) goto LAB_0026788d;
      (*pcStack_60)(&local_78,&local_80);
LAB_0026748f:
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar9 != local_50);
  }
  local_50 = &(local_40->annotations_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar9 = (local_40->annotations_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar9 != local_50) {
    do {
      uStack_70 = 0;
      pcStack_60 = std::
                   _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_78 = local_38;
      if ((char)local_48 != '\0') {
        pIVar7 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar7 != pIVar1) {
          bVar10 = false;
          do {
            local_80._M_head_impl = pIVar7;
            if (local_68 == (code *)0x0) goto LAB_0026788d;
            cVar4 = (*pcStack_60)(&local_78,&local_80);
            if (cVar4 == '\0') {
              if (!bVar10) goto LAB_00267572;
              break;
            }
            pIVar7 = pIVar7 + 1;
            bVar10 = pIVar7 == pIVar1;
          } while (!bVar10);
        }
      }
      local_80._M_head_impl = pIVar9;
      if (local_68 == (code *)0x0) goto LAB_0026788d;
      (*pcStack_60)(&local_78,&local_80);
LAB_00267572:
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar9 != local_50);
  }
  local_50 = &(local_40->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar9 = (local_40->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar9 != local_50) {
    do {
      uStack_70 = 0;
      pcStack_60 = std::
                   _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_78 = local_38;
      if ((char)local_48 != '\0') {
        pIVar7 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (pIVar9->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar7 != pIVar1) {
          bVar10 = false;
          do {
            local_80._M_head_impl = pIVar7;
            if (local_68 == (code *)0x0) goto LAB_0026788d;
            cVar4 = (*pcStack_60)(&local_78,&local_80);
            if (cVar4 == '\0') {
              if (!bVar10) goto LAB_00267655;
              break;
            }
            pIVar7 = pIVar7 + 1;
            bVar10 = pIVar7 == pIVar1;
          } while (!bVar10);
        }
      }
      local_80._M_head_impl = pIVar9;
      if (local_68 == (code *)0x0) goto LAB_0026788d;
      (*pcStack_60)(&local_78,&local_80);
LAB_00267655:
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar9 != local_50);
  }
  local_50 = &(local_40->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.
              sentinel_;
  pIVar6 = (local_40->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
           .super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar6 != local_50) {
    do {
      uStack_70 = 0;
      pcStack_60 = std::
                   _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_78 = local_38;
      if ((char)local_48 != '\0') {
        pIVar8 = (pIVar6->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar2 = (pIVar6->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar8 != pIVar2) {
          bVar10 = false;
          do {
            local_80._M_head_impl = pIVar8;
            if (local_68 == (code *)0x0) goto LAB_0026788d;
            cVar4 = (*pcStack_60)(&local_78,&local_80);
            if (cVar4 == '\0') {
              if (!bVar10) goto LAB_00267738;
              break;
            }
            pIVar8 = pIVar8 + 1;
            bVar10 = pIVar8 == pIVar2;
          } while (!bVar10);
        }
      }
      local_80._M_head_impl = pIVar6;
      if (local_68 == (code *)0x0) goto LAB_0026788d;
      (*pcStack_60)(&local_78,&local_80);
LAB_00267738:
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      pIVar6 = (pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar6 != local_50);
  }
  f_00 = local_38;
  puVar5 = (local_40->functions_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (local_40->functions_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar3) {
    bVar10 = (bool)(char)local_48;
    do {
      Function::ForEachInst
                ((puVar5->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                 .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl,f_00,bVar10,
                 true);
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar3);
  }
  if ((char)local_48 != '\0') {
    pIVar6 = (local_40->trailing_dbg_line_info_).
             super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_48 = (local_40->trailing_dbg_line_info_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (pIVar6 != local_48) {
      local_78 = f_00;
      do {
        uStack_70 = 0;
        pcStack_60 = std::
                     _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                     ::_M_invoke;
        local_68 = std::
                   _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                   ::_M_manager;
        pIVar8 = (pIVar6->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar2 = (pIVar6->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar8 != pIVar2) {
          bVar10 = false;
          do {
            local_80._M_head_impl = pIVar8;
            if (local_68 == (code *)0x0) goto LAB_0026788d;
            cVar4 = (*pcStack_60)(&local_78,&local_80);
            if (cVar4 == '\0') {
              if (!bVar10) goto LAB_00267853;
              break;
            }
            pIVar8 = pIVar8 + 1;
            bVar10 = pIVar8 == pIVar2;
          } while (!bVar10);
        }
        local_80._M_head_impl = pIVar6;
        if (local_68 == (code *)0x0) goto LAB_0026788d;
        (*pcStack_60)(&local_78,&local_80);
LAB_00267853:
        if (local_68 != (code *)0x0) {
          (*local_68)(&local_78,&local_78,3);
        }
        pIVar6 = pIVar6 + 1;
        local_78 = local_38;
      } while (pIVar6 != local_48);
    }
  }
  return;
}

Assistant:

void Module::ForEachInst(const std::function<void(const Instruction*)>& f,
                         bool run_on_debug_line_insts) const {
#define DELEGATE(i) i.ForEachInst(f, run_on_debug_line_insts)
  for (auto& i : capabilities_) DELEGATE(i);
  for (auto& i : extensions_) DELEGATE(i);
  for (auto& i : ext_inst_imports_) DELEGATE(i);
  if (memory_model_)
    static_cast<const Instruction*>(memory_model_.get())
        ->ForEachInst(f, run_on_debug_line_insts);
  if (sampled_image_address_mode_)
    static_cast<const Instruction*>(sampled_image_address_mode_.get())
        ->ForEachInst(f, run_on_debug_line_insts);
  for (auto& i : entry_points_) DELEGATE(i);
  for (auto& i : execution_modes_) DELEGATE(i);
  for (auto& i : debugs1_) DELEGATE(i);
  for (auto& i : debugs2_) DELEGATE(i);
  for (auto& i : debugs3_) DELEGATE(i);
  for (auto& i : annotations_) DELEGATE(i);
  for (auto& i : types_values_) DELEGATE(i);
  for (auto& i : ext_inst_debuginfo_) DELEGATE(i);
  for (auto& i : functions_) {
    static_cast<const Function*>(i.get())->ForEachInst(
        f, run_on_debug_line_insts,
        /* run_on_non_semantic_insts = */ true);
  }
  if (run_on_debug_line_insts) {
    for (auto& i : trailing_dbg_line_info_) DELEGATE(i);
  }
#undef DELEGATE
}